

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O3

void addsig(int sig)

{
  sigaction local_a8;
  
  memset(&local_a8.sa_mask,0,0x90);
  local_a8.__sigaction_handler.sa_handler = timerHandle;
  local_a8.sa_flags = 0x10000000;
  sigfillset(&local_a8.sa_mask);
  sigaction(sig,&local_a8,(sigaction *)0x0);
  return;
}

Assistant:

void addsig(int sig)
{
    struct sigaction sa;
    memset(&sa, 0, sizeof(sa));
    sa.sa_handler = timerHandle;
    sa.sa_flags |= SA_RESTART;
    sigfillset(&sa.sa_mask);
    sigaction(sig, &sa, NULL);
}